

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint huffmanDecodeSymbol(LodePNGBitReader *reader,HuffmanTree *codetree)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  unsigned_short value;
  unsigned_short l;
  unsigned_short code;
  HuffmanTree *codetree_local;
  LodePNGBitReader *reader_local;
  
  uVar3 = peekBits(reader,9);
  uVar1 = (ushort)codetree->table_len[(ushort)uVar3];
  uVar2 = codetree->table_value[(ushort)uVar3];
  if (uVar1 < 10) {
    advanceBits(reader,(ulong)uVar1);
  }
  else {
    advanceBits(reader,9);
    uVar3 = peekBits(reader,(ulong)(uVar1 - 9));
    uVar2 = uVar2 + (short)uVar3;
    advanceBits(reader,(ulong)(codetree->table_len[uVar2] - 9));
    uVar2 = codetree->table_value[uVar2];
  }
  reader_local._4_4_ = (uint)uVar2;
  return reader_local._4_4_;
}

Assistant:

static unsigned huffmanDecodeSymbol(LodePNGBitReader* reader, const HuffmanTree* codetree) {
  unsigned short code = peekBits(reader, FIRSTBITS);
  unsigned short l = codetree->table_len[code];
  unsigned short value = codetree->table_value[code];
  if(l <= FIRSTBITS) {
    advanceBits(reader, l);
    return value;
  } else {
    advanceBits(reader, FIRSTBITS);
    value += peekBits(reader, l - FIRSTBITS);
    advanceBits(reader, codetree->table_len[value] - FIRSTBITS);
    return codetree->table_value[value];
  }
}